

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O0

Aig_Man_t * Ssw_SpeculativeReduction(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  int local_2c;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  Ssw_Man_t *p_local;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xd9,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  iVar2 = Aig_ManRegNum(p->pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xda,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  iVar2 = Aig_ManRegNum(p->pAig);
  iVar3 = Aig_ManCiNum(p->pAig);
  if (iVar3 <= iVar2) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xdb,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  p->nConstrReduced = 0;
  p->nConstrTotal = 0;
  iVar2 = Aig_ManObjNumMax(p->pAig);
  p_00 = Aig_ManStart(iVar2 * p->nFrames);
  pcVar4 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pName = pcVar4;
  pAVar5 = Aig_ManConst1(p->pAig);
  pAVar6 = Aig_ManConst1(p_00);
  Ssw_ObjSetFrame(p,pAVar5,0,pAVar6);
  for (local_2c = 0; iVar2 = Saig_ManPiNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_2c);
    pAVar6 = Aig_ObjCreateCi(p_00);
    Ssw_ObjSetFrame(p,pAVar5,0,pAVar6);
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    pAVar6 = Aig_ObjCreateCi(p_00);
    Ssw_ObjSetFrame(p,pAVar5,0,pAVar6);
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar5,0,0);
  }
  for (local_2c = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), local_2c < iVar2; local_2c = local_2c + 1)
  {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_2c);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,0);
      p1 = Ssw_ObjChild1Fra(p,pAVar5,0);
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      Ssw_ObjSetFrame(p,pAVar5,0,pAVar6);
      Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar5,0,0);
    }
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p->pAig), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->pAig->vCos;
    iVar2 = Saig_ManPoNum(p->pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    pAVar5 = Ssw_ObjChild0Fra(p,pAVar5,0);
    Aig_ObjCreateCo(p_00,pAVar5);
  }
  Aig_ManCleanup(p_00);
  iVar2 = Aig_ManRegNum(p->pAig);
  Aig_ManSetRegNum(p_00,iVar2);
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_SpeculativeReduction( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    pFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // set the constraints on the latch outputs
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    // add internal nodes of this frame
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    }
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLi( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjChild0Fra(p, pObj,0) );
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    Aig_ManSetRegNum( pFrames, Aig_ManRegNum(p->pAig) );
//    Abc_Print( 1, "SpecRed: Total constraints = %d. Reduced constraints = %d.\n", 
//        p->nConstrTotal, p->nConstrReduced );
    return pFrames;
}